

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  U *pUVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  pointer pnVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  Dring *pDVar12;
  long lVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  fpclass_type *pfVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  fpclass_type *pfVar19;
  int *piVar20;
  
  pUVar1 = &this->u;
  pDVar12 = (this->u).row.list.next;
  piVar20 = (this->u).row.max;
  if ((U *)pDVar12 == pUVar1) {
    uVar16 = 0;
  }
  else {
    piVar7 = (this->u).row.idx;
    pnVar8 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar9 = (this->u).row.len;
    piVar10 = (this->u).row.start;
    uVar18 = 0;
    do {
      iVar4 = pDVar12->idx;
      if (piVar10[iVar4] != (int)uVar18) {
        do {
          iVar4 = pDVar12->idx;
          iVar5 = piVar10[iVar4];
          iVar17 = (int)uVar18;
          piVar10[iVar4] = iVar17;
          iVar6 = piVar9[iVar4];
          piVar20[iVar4] = iVar6;
          if (0 < iVar6) {
            lVar13 = (long)iVar5;
            uVar18 = (long)iVar17;
            pfVar19 = &(pnVar8->m_backend).fpclass;
            do {
              piVar7[uVar18] = piVar7[lVar13];
              pfVar2 = pfVar19 + (long)iVar5 * 0x20;
              pfVar3 = pfVar19 + (long)iVar17 * 0x20 + -0x1e;
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
              pfVar15 = pfVar3;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *pfVar15 = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((pcVar14->data)._M_elems + 1);
                pfVar15 = pfVar15 + 1;
              }
              pfVar3[0x1c] = pfVar2[-2];
              *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
              *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
              lVar13 = lVar13 + 1;
              uVar18 = uVar18 + 1;
              pfVar19 = pfVar19 + 0x20;
            } while (lVar13 < iVar6 + iVar5);
          }
          uVar16 = (uint)uVar18;
          pDVar12 = pDVar12->next;
        } while ((U *)pDVar12 != pUVar1);
        piVar20 = (this->u).row.max;
        break;
      }
      iVar5 = piVar9[iVar4];
      uVar16 = (int)uVar18 + iVar5;
      uVar18 = (ulong)uVar16;
      piVar20[iVar4] = iVar5;
      pDVar12 = pDVar12->next;
    } while ((U *)pDVar12 != pUVar1);
  }
  piVar20[this->thedim] = 0;
  (this->u).row.used = uVar16;
  return;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}